

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O0

void __thiscall QPDFTokenizer::Token::~Token(Token *this)

{
  Token *this_local;
  
  std::__cxx11::string::~string((string *)&this->error_message);
  std::__cxx11::string::~string((string *)&this->raw_value);
  std::__cxx11::string::~string((string *)&this->value);
  return;
}

Assistant:

Token() :
            type(tt_bad)
        {
        }